

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O2

int oonf_packet_raw_add(oonf_packet_socket *pktsocket,int protocol,netaddr_socket *local,
                       os_interface *interf)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = os_fd_generic_getrawsocket
                    (&(pktsocket->scheduler_entry).fd,local,0,0,interf,
                     _oonf_packet_socket_subsystem.logging);
  if (iVar1 == 0) {
    _packet_add(pktsocket,local,interf);
    pktsocket->protocol = protocol;
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
oonf_packet_raw_add(
  struct oonf_packet_socket *pktsocket, int protocol, union netaddr_socket *local, struct os_interface *interf) {
  /* Init socket */
  if (os_fd_getrawsocket(&pktsocket->scheduler_entry.fd, local, false, 0, interf, LOG_PACKET)) {
    return -1;
  }

  _packet_add(pktsocket, local, interf);
  pktsocket->protocol = protocol;
  return 0;
}